

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O2

iterator __thiscall
GF2::MI<45UL,_GF2::MOGrlex<45UL>_>::Move(MI<45UL,_GF2::MOGrlex<45UL>_> *this,iterator pos)

{
  _List_node_base *__offout;
  uint in_EAX;
  _List_iterator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_> _Var1;
  size_t in_R9;
  iterator iVar2;
  
  _Var1 = std::
          __lower_bound<std::_List_iterator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>,GF2::MP<45ul,GF2::MOGrlex<45ul>>,__gnu_cxx::__ops::_Iter_less_val>
                    ((this->
                     super_list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                     ).
                     super__List_base<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next,pos._M_node,pos._M_node + 1);
  __offout = (pos._M_node)->_M_next;
  iVar2._M_node = _Var1._M_node;
  if ((_Var1._M_node != pos._M_node) ||
     (_Var1 = std::
              __lower_bound<std::_List_iterator<GF2::MP<45ul,GF2::MOGrlex<45ul>>>,GF2::MP<45ul,GF2::MOGrlex<45ul>>,__gnu_cxx::__ops::_Iter_less_val>
                        (__offout,this,pos._M_node + 1), iVar2._M_node = pos._M_node,
     _Var1._M_node != __offout)) {
    std::__cxx11::
    list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>::
    splice(&this->
            super_list<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>,_std::allocator<GF2::MP<45UL,_GF2::MOGrlex<45UL>_>_>_>
           ,(int)_Var1._M_node,(__off64_t *)this,(int)pos._M_node,(__off64_t *)__offout,in_R9,in_EAX
          );
    pos._M_node = iVar2._M_node;
  }
  return (iterator)pos._M_node;
}

Assistant:

iterator Move(iterator pos)
	{
		assert(*pos != 0);
		iterator where, after = pos;
		where = std::lower_bound(begin(), pos, *pos), ++after;
		// перемещаем в младшую сторону?
		if (where != pos)
			splice(where, *this, pos, after);
		else
		{
			where = std::lower_bound(after, end(), *pos);
			// перемещаем в старшую сторону?
			if (where != after)
				splice(where, *this, pos, after);
			// не перемещаем
			where = pos;
		}
		return where;
	}